

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateExpandDimsLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  int iVar1;
  uint uVar2;
  string *psVar3;
  string *psVar4;
  bool bVar5;
  LayerUnion LVar6;
  long *plVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  undefined8 *puVar9;
  size_type *psVar10;
  long *plVar11;
  pointer pcVar12;
  string *psVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  Result *pRVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  _Alloc_hider _Var20;
  string *psVar21;
  string *psVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  int iVar25;
  string err_1;
  int a;
  set<int,_std::less<int>,_std::allocator<int>_> axes_set;
  Result r;
  string local_118;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  Result *local_d8;
  long *local_d0 [2];
  long local_c0 [2];
  int local_ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  iterator iStack_a0;
  int *local_98;
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  undefined1 local_78 [24];
  size_t local_60;
  pointer local_58;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_d8 = __return_storage_ptr__;
  Result::Result((Result *)&local_58);
  validateInputCount((Result *)local_88,layer,1,1);
  local_58 = (pointer)local_88;
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_80);
  if (local_80._M_p != local_78 + 8) {
    operator_delete(local_80._M_p,(ulong)(local_78._8_8_ + 1));
  }
  bVar5 = Result::good((Result *)&local_58);
  if (bVar5) {
    validateOutputCount((Result *)local_88,layer,1,1);
    local_58 = (pointer)local_88;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_80);
    if (local_80._M_p != local_78 + 8) {
      operator_delete(local_80._M_p,(ulong)(local_78._8_8_ + 1));
    }
  }
  if (layer->_oneof_case_[0] == 0x465) {
    LVar6 = layer->layer_;
  }
  else {
    LVar6.expanddims_ = Specification::ExpandDimsLayerParams::default_instance();
  }
  if (((LVar6.convolution_)->kernelsize_).current_size_ != 0) {
    local_80._M_p = (pointer)((ulong)local_80._M_p._4_4_ << 0x20);
    iVar25 = 0;
    local_78._0_8_ = (string *)0x0;
    local_60 = 0;
    local_78._8_8_ = (string *)&local_80;
    local_78._16_8_ = (string *)&local_80;
    do {
      if (layer->_oneof_case_[0] == 0x465) {
        LVar6 = layer->layer_;
      }
      else {
        LVar6.expanddims_ = Specification::ExpandDimsLayerParams::default_instance();
      }
      if (((LVar6.convolution_)->kernelsize_).current_size_ <= iVar25) {
        if (((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) ||
           ((layer->outputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1)) goto LAB_002d754d;
        iVar25 = *(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements[0]
                         + 0x24);
        uVar2 = *(uint *)((long)((layer->outputtensor_).super_RepeatedPtrFieldBase.rep_)->elements
                                [0] + 0x24);
        if (layer->_oneof_case_[0] == 0x465) {
          LVar6 = layer->layer_;
        }
        else {
          LVar6.expanddims_ = Specification::ExpandDimsLayerParams::default_instance();
        }
        iVar16 = ((LVar6.convolution_)->kernelsize_).current_size_;
        if (iVar25 + iVar16 == uVar2) {
          local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
          iStack_a0._M_current = (int *)0x0;
          local_98 = (int *)0x0;
          iVar25 = 0;
          goto LAB_002d71d8;
        }
        psVar3 = (layer->name_).ptr_;
        pcVar12 = (psVar3->_M_dataplus)._M_p;
        local_d0[0] = local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d0,pcVar12,pcVar12 + psVar3->_M_string_length);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)local_d0,0,(char *)0x0,0x31ab2e);
        plVar11 = plVar7 + 2;
        if ((long *)*plVar7 == plVar11) {
          local_e8 = *plVar11;
          lStack_e0 = plVar7[3];
          local_f8 = &local_e8;
        }
        else {
          local_e8 = *plVar11;
          local_f8 = (long *)*plVar7;
        }
        local_f0 = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        psVar10 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_118.field_2._M_allocated_capacity = *psVar10;
          local_118.field_2._8_8_ = puVar9[3];
        }
        else {
          local_118.field_2._M_allocated_capacity = *psVar10;
          local_118._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_118._M_string_length = puVar9[1];
        *puVar9 = psVar10;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        if (local_d0[0] != local_c0) {
          operator_delete(local_d0[0],local_c0[0] + 1);
        }
        pRVar15 = local_d8;
        Result::Result(local_d8,INVALID_MODEL_PARAMETERS,&local_118);
        goto LAB_002d74da;
      }
      if (layer->_oneof_case_[0] == 0x465) {
        LVar6 = layer->layer_;
      }
      else {
        LVar6.expanddims_ = Specification::ExpandDimsLayerParams::default_instance();
      }
      plVar7 = google::protobuf::RepeatedField<long>::Get(&(LVar6.reshape_)->targetshape_,iVar25);
      iVar16 = (int)*plVar7;
      local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)CONCAT44(local_a8._4_4_,iVar16);
      psVar4 = (string *)local_78._0_8_;
      psVar22 = (string *)&local_80;
      if ((string *)local_78._0_8_ != (string *)0x0) {
        do {
          psVar21 = psVar22;
          psVar13 = psVar4;
          iVar1 = *(int *)(psVar13 + 0x20);
          psVar22 = psVar13;
          if (iVar1 < iVar16) {
            psVar22 = psVar21;
          }
          psVar4 = *(string **)(psVar13 + (ulong)(iVar1 < iVar16) * 8 + 0x10);
        } while (*(string **)(psVar13 + (ulong)(iVar1 < iVar16) * 8 + 0x10) != (string *)0x0);
        if (psVar22 != (string *)&local_80) {
          if (iVar1 < iVar16) {
            psVar13 = psVar21;
          }
          if (*(int *)(psVar13 + 0x20) <= iVar16) goto LAB_002d7052;
        }
      }
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 local_88,(int *)&local_a8);
      iVar25 = iVar25 + 1;
    } while( true );
  }
  psVar3 = (layer->name_).ptr_;
  pcVar12 = (psVar3->_M_dataplus)._M_p;
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f8,pcVar12,pcVar12 + psVar3->_M_string_length);
  puVar9 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x31ab2e);
  psVar10 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_118.field_2._M_allocated_capacity = *psVar10;
    local_118.field_2._8_8_ = puVar9[3];
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar10;
    local_118._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_118._M_string_length = puVar9[1];
  *puVar9 = psVar10;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
  pcVar12 = (pointer)(puVar9 + 2);
  if ((pointer)*puVar9 == pcVar12) {
    local_78._0_8_ = *(undefined8 *)pcVar12;
    local_78._8_8_ = puVar9[3];
    local_88 = (undefined1  [8])local_78;
  }
  else {
    local_78._0_8_ = *(undefined8 *)pcVar12;
    local_88 = (undefined1  [8])*puVar9;
  }
  local_80._M_p = (pointer)puVar9[1];
  *puVar9 = pcVar12;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  pRVar15 = local_d8;
  Result::Result(local_d8,INVALID_MODEL_PARAMETERS,(string *)local_88);
  if (local_88 != (undefined1  [8])local_78) {
    operator_delete((void *)local_88,(ulong)(local_78._0_8_ + 1));
  }
  goto LAB_002d77d4;
LAB_002d7052:
  psVar3 = (layer->name_).ptr_;
  pcVar12 = (psVar3->_M_dataplus)._M_p;
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,pcVar12,pcVar12 + psVar3->_M_string_length);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_d0,0,(char *)0x0,0x31ab2e);
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_e8 = *plVar11;
    lStack_e0 = plVar7[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *plVar11;
    local_f8 = (long *)*plVar7;
  }
  local_f0 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  psVar10 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_118.field_2._M_allocated_capacity = *psVar10;
    local_118.field_2._8_8_ = puVar9[3];
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar10;
    local_118._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_118._M_string_length = puVar9[1];
  *puVar9 = psVar10;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,local_e8 + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  pRVar15 = local_d8;
  Result::Result(local_d8,INVALID_MODEL_PARAMETERS,&local_118);
LAB_002d74da:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    uVar18 = local_118.field_2._M_allocated_capacity + 1;
    _Var20._M_p = local_118._M_dataplus._M_p;
LAB_002d77c2:
    operator_delete(_Var20._M_p,uVar18);
  }
  goto LAB_002d77c7;
  while( true ) {
    if (_Var8._M_current == local_98) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_a8,iStack_a0,&local_ac);
    }
    else {
      *iStack_a0._M_current = local_ac;
      iStack_a0._M_current = iStack_a0._M_current + 1;
    }
    iVar25 = iVar25 + 1;
    if (iVar16 == iVar25) break;
LAB_002d71d8:
    if (layer->_oneof_case_[0] == 0x465) {
      LVar6 = layer->layer_;
    }
    else {
      LVar6.expanddims_ = Specification::ExpandDimsLayerParams::default_instance();
    }
    plVar7 = google::protobuf::RepeatedField<long>::Get(&(LVar6.reshape_)->targetshape_,iVar25);
    local_ac = ((int)*plVar7 >> 0x1f & uVar2) + (int)*plVar7;
    _Var8 = std::
            __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                      (local_a8,iStack_a0._M_current,&local_ac);
    if (_Var8._M_current != iStack_a0._M_current) {
      psVar3 = (layer->name_).ptr_;
      pcVar12 = (psVar3->_M_dataplus)._M_p;
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_d0,pcVar12,pcVar12 + psVar3->_M_string_length);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_d0,0,(char *)0x0,0x31ab2e);
      plVar11 = plVar7 + 2;
      if ((long *)*plVar7 == plVar11) {
        local_e8 = *plVar11;
        lStack_e0 = plVar7[3];
        local_f8 = &local_e8;
      }
      else {
        local_e8 = *plVar11;
        local_f8 = (long *)*plVar7;
      }
      local_f0 = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      psVar10 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_118.field_2._M_allocated_capacity = *psVar10;
        local_118.field_2._8_8_ = puVar9[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar10;
        local_118._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_118._M_string_length = puVar9[1];
      *puVar9 = psVar10;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      if (local_f8 != &local_e8) {
        operator_delete(local_f8,local_e8 + 1);
      }
      if (local_d0[0] != local_c0) {
        operator_delete(local_d0[0],local_c0[0] + 1);
      }
      pRVar15 = local_d8;
      Result::Result(local_d8,INVALID_MODEL_PARAMETERS,&local_118);
      goto LAB_002d7797;
    }
  }
  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_a8->_M_local_buf + 4);
  iVar25 = *(int *)local_a8;
  paVar19 = local_a8;
  paVar23 = local_a8;
  paVar24 = paVar14;
  iVar16 = iVar25;
  if (paVar14 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iStack_a0._M_current &&
      local_a8 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)iStack_a0._M_current) {
    do {
      iVar1 = *(int *)paVar24;
      iVar17 = iVar16;
      if (iVar16 <= iVar1) {
        iVar17 = iVar1;
      }
      if (iVar16 < iVar1) {
        paVar23 = paVar24;
      }
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar24 + 4);
      iVar16 = iVar17;
    } while (paVar24 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)iStack_a0._M_current);
    do {
      if (*(int *)paVar14 < iVar25) {
        paVar19 = paVar14;
        iVar25 = *(int *)paVar14;
      }
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)paVar14 + 4);
      iVar16 = *(int *)paVar23;
    } while (paVar14 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)iStack_a0._M_current);
  }
  if ((iVar16 < (int)uVar2) && (-1 < *(int *)paVar19)) {
    operator_delete(local_a8,(long)local_98 - (long)local_a8);
LAB_002d754d:
    *(pointer *)local_d8 = local_58;
    paVar14 = &(local_d8->m_message).field_2;
    (local_d8->m_message)._M_dataplus._M_p = (pointer)paVar14;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_p == &local_40) {
      paVar14->_M_allocated_capacity =
           CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]);
      *(undefined8 *)((long)&(local_d8->m_message).field_2 + 8) = local_40._8_8_;
    }
    else {
      (local_d8->m_message)._M_dataplus._M_p = local_50._M_p;
      (local_d8->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]);
    }
    (local_d8->m_message)._M_string_length = local_48;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    pRVar15 = local_d8;
    local_50._M_p = (pointer)&local_40;
  }
  else {
    psVar3 = (layer->name_).ptr_;
    pcVar12 = (psVar3->_M_dataplus)._M_p;
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,pcVar12,pcVar12 + psVar3->_M_string_length);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)local_d0,0,(char *)0x0,0x31ab2e);
    plVar11 = plVar7 + 2;
    if ((long *)*plVar7 == plVar11) {
      local_e8 = *plVar11;
      lStack_e0 = plVar7[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *plVar11;
      local_f8 = (long *)*plVar7;
    }
    local_f0 = plVar7[1];
    *plVar7 = (long)plVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    psVar10 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_118.field_2._M_allocated_capacity = *psVar10;
      local_118.field_2._8_8_ = puVar9[3];
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar10;
      local_118._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_118._M_string_length = puVar9[1];
    *puVar9 = psVar10;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    pRVar15 = local_d8;
    Result::Result(local_d8,INVALID_MODEL_PARAMETERS,&local_118);
LAB_002d7797:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      uVar18 = (long)local_98 - (long)local_a8;
      _Var20._M_p = (pointer)local_a8;
      goto LAB_002d77c2;
    }
  }
LAB_002d77c7:
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_88);
LAB_002d77d4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
  }
  return pRVar15;
}

Assistant:

Result NeuralNetworkSpecValidator::validateExpandDimsLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (layer.expanddims().axes_size() == 0) {
        std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': length of the 'axes' parameter cannot be 0.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // either all values in axes must be positive or all negative
    std::set<int> axes_set;
    for (int i=0; i<layer.expanddims().axes_size(); i++) {
        int a = (int)layer.expanddims().axes(i);
        if (axes_set.find(a) != axes_set.end()) {
            std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': all the values in the 'axes' parameter must be unique.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        } else {
            axes_set.insert(a);
        }
    }

    if (layer.inputtensor_size() > 0 && layer.outputtensor_size() > 0) {
        int input_rank = static_cast<int>(layer.inputtensor(0).rank());
        int output_rank = static_cast<int>(layer.outputtensor(0).rank());
        int axes_length = layer.expanddims().axes_size();

        if (input_rank + axes_length != output_rank) {
            std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': input rank plus the length of the axes parameter must equal output rank.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }

        std::vector<int> axes;
        for (int i=0; i<axes_length; i++) {
            int a = (int)layer.expanddims().axes(i);
            if (a < 0) {
                a = output_rank + a;
            }
            if (std::find(axes.begin(), axes.end(), a) != axes.end()) {
                std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': axes parameter list cannot have the same value more than once.";
                return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
            }
            axes.push_back(a);
        }

        int max_value = *std::max_element(axes.begin(), axes.end());
        int min_value = *std::min_element(axes.begin(), axes.end());
        if (max_value > output_rank - 1 || min_value < 0) {
            std::string err = "ExpandDims Layer '" + std::string(layer.name()) + "': axes refers to a dimension that exceeds the output rank.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }

    return r;
}